

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::FileGenerator::Generate(FileGenerator *this,Printer *printer)

{
  string *psVar1;
  __uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
  _Var2;
  __uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
  _Var3;
  GeneratorFactory *pGVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  FileDescriptor *pFVar7;
  EnumDescriptor *pEVar8;
  Descriptor *descriptor;
  ServiceDescriptor *pSVar9;
  int i_2;
  int iVar10;
  int index;
  int i_6;
  int i;
  long lVar12;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view varname;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view annotation_file;
  string_view file_name;
  string_view java_class_name;
  allocator<char> local_101;
  int static_block_bytecode_estimate;
  pointer local_f8;
  int method_num;
  undefined4 uStack_cc;
  size_t local_c8;
  int bytecode_estimate;
  undefined1 auStack_ac [12];
  Options local_80;
  pointer pcVar11;
  
  psVar1 = this->file_->name_;
  local_f8 = (psVar1->_M_dataplus)._M_p;
  _static_block_bytecode_estimate = (char *)psVar1->_M_string_length;
  text._M_str = 
  "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// NO CHECKED-IN PROTOBUF GENCODE\n// source: $filename$\n"
  ;
  text._M_len = 0x74;
  io::Printer::Print<char[9],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text,(char (*) [9])"filename",
             (basic_string_view<char,_std::char_traits<char>_> *)&static_block_bytecode_estimate);
  if ((this->options_).opensource_runtime == true) {
    text_00._M_str = "// Protobuf Java Version: $protobuf_java_version$\n";
    text_00._M_len = 0x32;
    io::Printer::Print<char[22],char[11]>
              (printer,text_00,(char (*) [22])"protobuf_java_version",(char (*) [11])"4.31.0-dev");
  }
  text_01._M_str = "\n";
  text_01._M_len = 1;
  io::Printer::Print<>(printer,text_01);
  if ((this->java_package_)._M_string_length != 0) {
    text_02._M_str = "package $package$;\n\n";
    text_02._M_len = 0x14;
    io::Printer::Print<char[8],std::__cxx11::string>
              (printer,text_02,(char (*) [8])0x5cd2c3,&this->java_package_);
  }
  if ((this->options_).annotate_code == true) {
    local_f8 = (this->classname_)._M_dataplus._M_p;
    _static_block_bytecode_estimate = (char *)(this->classname_)._M_string_length;
    _bytecode_estimate = absl::lts_20250127::NullSafeStringView(".java.pb.meta");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&method_num,(lts_20250127 *)&static_block_bytecode_estimate,
               (AlphaNum *)&bytecode_estimate,(AlphaNum *)&bytecode_estimate);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&method_num,"",&local_101);
  }
  annotation_file._M_str._4_4_ = uStack_cc;
  annotation_file._M_str._0_4_ = method_num;
  Options::Options(&local_80,&this->options_);
  annotation_file._M_len = local_c8;
  PrintGeneratedAnnotation(printer,'$',annotation_file,&local_80);
  Options::~Options(&local_80);
  std::__cxx11::string::~string((string *)&method_num);
  if ((this->options_).opensource_runtime == false) {
    text_03._M_str = "@com.google.protobuf.Internal.ProtoNonnullApi\n";
    text_03._M_len = 0x2e;
    io::Printer::Print<>(printer,text_03);
  }
  _static_block_bytecode_estimate = "";
  if ((this->file_->options_->field_0)._impl_.deprecated_ != false) {
    _static_block_bytecode_estimate = "@java.lang.Deprecated ";
  }
  text_04._M_str = "$deprecation$public final class $classname$ {\n  private $ctor$() {}\n";
  text_04._M_len = 0x44;
  io::Printer::
  Print<char[12],char_const*,char[10],std::__cxx11::string,char[5],std::__cxx11::string>
            (printer,text_04,(char (*) [12])0x56da69,(char **)&static_block_bytecode_estimate,
             (char (*) [10])0x475c54,&this->classname_,(char (*) [5])0x46bff9,&this->classname_);
  psVar1 = this->file_->name_;
  pcVar11 = (psVar1->_M_dataplus)._M_p;
  varname._M_str = "classname";
  varname._M_len = 9;
  file_name._M_str = pcVar11;
  file_name._M_len = psVar1->_M_string_length;
  io::Printer::Annotate
            (printer,varname,file_name,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  if ((((this->context_)._M_t.
        super___uniq_ptr_impl<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::java::Context_*,_std::default_delete<google::protobuf::compiler::java::Context>_>
        .super__Head_base<0UL,_google::protobuf::compiler::java::Context_*,_false>._M_head_impl)->
      options_).enforce_lite == false) {
    text_05._M_str = "static {\n";
    text_05._M_len = 9;
    io::Printer::Print<>(printer,text_05);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    java_class_name._M_str = pcVar11;
    java_class_name._M_len = (size_t)(this->classname_)._M_dataplus._M_p;
    PrintGencodeVersionValidator
              ((java *)printer,(Printer *)(ulong)(this->options_).opensource_runtime,
               SUB81((this->classname_)._M_string_length,0),java_class_name);
    io::Printer::Outdent(printer);
    text_06._M_str = "}\n";
    text_06._M_len = 2;
    io::Printer::Print<>(printer,text_06);
  }
  text_07._M_str =
       "public static void registerAllExtensions(\n    com.google.protobuf.ExtensionRegistryLite registry) {\n"
  ;
  text_07._M_len = 100;
  io::Printer::Print<>(printer,text_07);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  lVar12 = 0;
  while( true ) {
    pFVar7 = this->file_;
    if (pFVar7->extension_count_ <= lVar12) break;
    _Var2._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
    .super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>.
    _M_head_impl = (this->extension_generators_).
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar12]._M_t.
                   super___uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                   ._M_t;
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                          .
                          super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>
                          ._M_head_impl + 0x20))
              (_Var2._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
               .super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>
               ._M_head_impl,printer);
    lVar12 = lVar12 + 1;
  }
  for (lVar12 = 0; lVar12 < pFVar7->message_type_count_; lVar12 = lVar12 + 1) {
    _Var3._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
    .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>._M_head_impl
         = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar12]._M_t.
           super___uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
           ._M_t;
    (**(code **)(*(long *)_Var3._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                          .
                          super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                          ._M_head_impl + 0x30))
              (_Var3._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
               .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>.
               _M_head_impl,printer);
    pFVar7 = this->file_;
  }
  io::Printer::Outdent(printer);
  text_08._M_str = "}\n";
  text_08._M_len = 2;
  io::Printer::Print<>(printer,text_08);
  if ((((this->context_)._M_t.
        super___uniq_ptr_impl<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::java::Context_*,_std::default_delete<google::protobuf::compiler::java::Context>_>
        .super__Head_base<0UL,_google::protobuf::compiler::java::Context_*,_false>._M_head_impl)->
      options_).enforce_lite == false) {
    text_09._M_str =
         "\npublic static void registerAllExtensions(\n    com.google.protobuf.ExtensionRegistry registry) {\n  registerAllExtensions(\n      (com.google.protobuf.ExtensionRegistryLite) registry);\n}\n"
    ;
    text_09._M_len = 0xb9;
    io::Printer::Print<>(printer,text_09);
  }
  for (iVar10 = 0; pFVar7 = this->file_, iVar10 < pFVar7->enum_type_count_; iVar10 = iVar10 + 1) {
    pEVar8 = FileDescriptor::enum_type(pFVar7,iVar10);
    bVar6 = NestedInFileClass(pEVar8,this->immutable_api_);
    if (bVar6) {
      pGVar4 = (this->generator_factory_)._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
               .super__Head_base<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_false>.
               _M_head_impl;
      pEVar8 = FileDescriptor::enum_type(this->file_,iVar10);
      (*pGVar4->_vptr_GeneratorFactory[3])(&static_block_bytecode_estimate,pGVar4,pEVar8);
      (**(code **)(*(long *)_static_block_bytecode_estimate + 0x10))
                (_static_block_bytecode_estimate,printer);
      if ((long *)_static_block_bytecode_estimate != (long *)0x0) {
        (**(code **)(*(long *)_static_block_bytecode_estimate + 8))();
      }
    }
  }
  for (lVar12 = 0; lVar12 < pFVar7->message_type_count_; lVar12 = lVar12 + 1) {
    descriptor = FileDescriptor::message_type(pFVar7,(int)lVar12);
    bVar6 = NestedInFileClass(descriptor,this->immutable_api_);
    if (bVar6) {
      _Var3._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>.
      _M_head_impl = (this->message_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar12]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                     ._M_t;
      (**(code **)(*(long *)_Var3._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                            .
                            super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                            ._M_head_impl + 0x28))
                (_Var3._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                 .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                 ._M_head_impl,printer);
      _Var3._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>.
      _M_head_impl = (this->message_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar12]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                     ._M_t;
      (**(code **)(*(long *)_Var3._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                            .
                            super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                            ._M_head_impl + 0x20))
                (_Var3._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                 .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                 ._M_head_impl,printer);
    }
    pFVar7 = this->file_;
  }
  iVar10 = pFVar7->service_count_;
  if (((0 < iVar10) &&
      ((((this->context_)._M_t.
         super___uniq_ptr_impl<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
         ._M_t.
         super__Tuple_impl<0UL,_google::protobuf::compiler::java::Context_*,_std::default_delete<google::protobuf::compiler::java::Context>_>
         .super__Head_base<0UL,_google::protobuf::compiler::java::Context_*,_false>._M_head_impl)->
       options_).enforce_lite == false)) &&
     ((pFVar7->options_->field_0)._impl_.java_generic_services_ == true)) {
    for (index = 0; index < iVar10; index = index + 1) {
      pSVar9 = FileDescriptor::service(pFVar7,index);
      bVar6 = NestedInFileClass(pSVar9,this->immutable_api_);
      if (bVar6) {
        pGVar4 = (this->generator_factory_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
                 .super__Head_base<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_false>
                 ._M_head_impl;
        pSVar9 = FileDescriptor::service(this->file_,index);
        (*pGVar4->_vptr_GeneratorFactory[5])(&static_block_bytecode_estimate,pGVar4,pSVar9);
        (**(code **)(*(long *)_static_block_bytecode_estimate + 0x10))
                  (_static_block_bytecode_estimate,printer);
        if ((long *)_static_block_bytecode_estimate != (long *)0x0) {
          (**(code **)(*(long *)_static_block_bytecode_estimate + 8))();
        }
      }
      pFVar7 = this->file_;
      iVar10 = pFVar7->service_count_;
    }
  }
  for (lVar12 = 0; lVar12 < pFVar7->extension_count_; lVar12 = lVar12 + 1) {
    _Var2._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
    .super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>.
    _M_head_impl = (this->extension_generators_).
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar12]._M_t.
                   super___uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                   ._M_t;
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                          .
                          super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>
                          ._M_head_impl + 0x10))
              (_Var2._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
               .super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>
               ._M_head_impl,printer);
    pFVar7 = this->file_;
  }
  _static_block_bytecode_estimate =
       (char *)((ulong)_static_block_bytecode_estimate & 0xffffffff00000000);
  for (lVar12 = 0; lVar12 < pFVar7->message_type_count_; lVar12 = lVar12 + 1) {
    _Var3._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
    .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>._M_head_impl
         = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar12]._M_t.
           super___uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
           ._M_t;
    (**(code **)(*(long *)_Var3._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                          .
                          super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                          ._M_head_impl + 0x10))
              (_Var3._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
               .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>.
               _M_head_impl,printer,&static_block_bytecode_estimate);
    pFVar7 = this->file_;
  }
  text_10._M_str = "\n";
  text_10._M_len = 1;
  io::Printer::Print<>(printer,text_10);
  if ((((this->context_)._M_t.
        super___uniq_ptr_impl<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::java::Context_*,_std::default_delete<google::protobuf::compiler::java::Context>_>
        .super__Head_base<0UL,_google::protobuf::compiler::java::Context_*,_false>._M_head_impl)->
      options_).enforce_lite == false) {
    if (this->immutable_api_ == true) {
      GenerateDescriptorInitializationCodeForImmutable(this,printer);
    }
  }
  else {
    text_11._M_str = "static {\n";
    text_11._M_len = 9;
    io::Printer::Print<>(printer,text_11);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    auVar5._12_4_ = 0;
    auVar5._0_12_ = auStack_ac;
    _bytecode_estimate = (string_view)(auVar5 << 0x20);
    method_num = 0;
    for (lVar12 = 0; lVar12 < this->file_->message_type_count_; lVar12 = lVar12 + 1) {
      _Var3._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>.
      _M_head_impl = (this->message_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar12]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                     ._M_t;
      iVar10 = (**(code **)(*(long *)_Var3._M_t.
                                     super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                                     .
                                     super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                                     ._M_head_impl + 0x18))
                         (_Var3._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                          .
                          super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                          ._M_head_impl,printer);
      bytecode_estimate = bytecode_estimate + iVar10;
      java::anon_unknown_0::MaybeRestartJavaMethod
                (printer,&bytecode_estimate,&method_num,"_clinit_autosplit_$method_num$();\n",
                 "private static void _clinit_autosplit_$method_num$() {\n");
    }
    io::Printer::Outdent(printer);
    text_12._M_str = "}\n";
    text_12._M_len = 2;
    io::Printer::Print<>(printer,text_12);
  }
  text_13._M_str = "\n// @@protoc_insertion_point(outer_class_scope)\n";
  text_13._M_len = 0x30;
  io::Printer::Print<>(printer,text_13);
  io::Printer::Outdent(printer);
  text_14._M_str = "}\n";
  text_14._M_len = 2;
  io::Printer::Print<>(printer,text_14);
  return;
}

Assistant:

void FileGenerator::Generate(io::Printer* printer) {
  // We don't import anything because we refer to all classes by their
  // fully-qualified names in the generated source.
  printer->Print(
      "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
      "// NO CHECKED-IN PROTOBUF "
      // Intentional line breaker
      "GENCODE\n"
      "// source: $filename$\n",
      "filename", file_->name());
  if (options_.opensource_runtime) {
    printer->Print("// Protobuf Java Version: $protobuf_java_version$\n",
                   "protobuf_java_version", PROTOBUF_JAVA_VERSION_STRING);
  }
  printer->Print("\n");
  if (!java_package_.empty()) {
    printer->Print(
        "package $package$;\n"
        "\n",
        "package", java_package_);
  }
  PrintGeneratedAnnotation(
      printer, '$',
      options_.annotate_code ? absl::StrCat(classname_, ".java.pb.meta") : "",
      options_);

  if (!options_.opensource_runtime) {
    printer->Print("@com.google.protobuf.Internal.ProtoNonnullApi\n");
  }
  printer->Print(
      "$deprecation$public final class $classname$ {\n"
      "  private $ctor$() {}\n",
      "deprecation",
      file_->options().deprecated() ? "@java.lang.Deprecated " : "",
      "classname", classname_, "ctor", classname_);
  printer->Annotate("classname", file_->name());
  printer->Indent();

  if (!context_->EnforceLite()) {
    printer->Print("static {\n");
    printer->Indent();
    PrintGencodeVersionValidator(printer, options_.opensource_runtime,
                                 classname_);
    printer->Outdent();
    printer->Print("}\n");
  }

  // -----------------------------------------------------------------

  printer->Print(
      "public static void registerAllExtensions(\n"
      "    com.google.protobuf.ExtensionRegistryLite registry) {\n");

  printer->Indent();

  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateExtensionRegistrationCode(printer);
  }

  printer->Outdent();
  printer->Print("}\n");
  if (HasDescriptorMethods(file_, context_->EnforceLite())) {
    // Overload registerAllExtensions for the non-lite usage to
    // redundantly maintain the original signature (this is
    // redundant because ExtensionRegistryLite now invokes
    // ExtensionRegistry in the non-lite usage). Intent is
    // to remove this in the future.
    printer->Print(
        "\n"
        "public static void registerAllExtensions(\n"
        "    com.google.protobuf.ExtensionRegistry registry) {\n"
        "  registerAllExtensions(\n"
        "      (com.google.protobuf.ExtensionRegistryLite) registry);\n"
        "}\n");
  }

  // -----------------------------------------------------------------

  for (int i = 0; i < file_->enum_type_count(); i++) {
    if (NestedInFileClass(*file_->enum_type(i), immutable_api_)) {
      generator_factory_->NewEnumGenerator(file_->enum_type(i))
          ->Generate(printer);
    }
  }
  for (int i = 0; i < file_->message_type_count(); i++) {
    if (NestedInFileClass(*file_->message_type(i), immutable_api_)) {
      message_generators_[i]->GenerateInterface(printer);
      message_generators_[i]->Generate(printer);
    }
  }
  if (HasGenericServices(file_, context_->EnforceLite())) {
    for (int i = 0; i < file_->service_count(); i++) {
      if (NestedInFileClass(*file_->service(i), immutable_api_)) {
        std::unique_ptr<ServiceGenerator> generator(
            generator_factory_->NewServiceGenerator(file_->service(i)));
        generator->Generate(printer);
      }
    }
  }

  // Extensions must be generated in the outer class since they are values,
  // not classes.
  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->Generate(printer);
  }

  // Static variables. We'd like them to be final if possible, but due to
  // the JVM's 64k size limit on static blocks, we have to initialize some
  // of them in methods; thus they cannot be final.
  int static_block_bytecode_estimate = 0;
  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateStaticVariables(
        printer, &static_block_bytecode_estimate);
  }

  printer->Print("\n");

  if (HasDescriptorMethods(file_, context_->EnforceLite())) {
    if (immutable_api_) {
      GenerateDescriptorInitializationCodeForImmutable(printer);
    }
  } else {
    printer->Print("static {\n");
    printer->Indent();
    int bytecode_estimate = 0;
    int method_num = 0;

    for (int i = 0; i < file_->message_type_count(); i++) {
      bytecode_estimate +=
          message_generators_[i]->GenerateStaticVariableInitializers(printer);
      MaybeRestartJavaMethod(
          printer, &bytecode_estimate, &method_num,
          "_clinit_autosplit_$method_num$();\n",
          "private static void _clinit_autosplit_$method_num$() {\n");
    }

    printer->Outdent();
    printer->Print("}\n");
  }

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(outer_class_scope)\n");

  printer->Outdent();
  printer->Print("}\n");
}